

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Combine<duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar3 = 0;
    do {
      if (**(long **)(pdVar1 + iVar3 * 8) != (*(long **)(pdVar1 + iVar3 * 8))[1]) {
        ::std::vector<long,std::allocator<long>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                  (*(vector<long,std::allocator<long>> **)(pdVar2 + iVar3 * 8),
                   *(undefined8 *)(*(vector<long,std::allocator<long>> **)(pdVar2 + iVar3 * 8) + 8))
        ;
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}